

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ocl_init.cpp
# Opt level: O0

int ocl_init(void)

{
  OclLibrary handle;
  OclLibrary lib;
  
  if (pfn_clGetPlatformIDs == (p_pfn_clGetPlatformIDs)0x0) {
    handle = oclLoadLibrary();
    if (handle == (OclLibrary)0x0) {
      lib._4_4_ = 0;
    }
    else {
      pfn_clGetPlatformIDs = (p_pfn_clGetPlatformIDs)oclGetProcAddress(handle,"clGetPlatformIDs");
      pfn_clGetPlatformInfo = (p_pfn_clGetPlatformInfo)oclGetProcAddress(handle,"clGetPlatformInfo")
      ;
      pfn_clGetDeviceIDs = (p_pfn_clGetDeviceIDs)oclGetProcAddress(handle,"clGetDeviceIDs");
      pfn_clGetDeviceInfo = (p_pfn_clGetDeviceInfo)oclGetProcAddress(handle,"clGetDeviceInfo");
      pfn_clCreateContext = (p_pfn_clCreateContext)oclGetProcAddress(handle,"clCreateContext");
      pfn_clCreateContextFromType =
           (p_pfn_clCreateContextFromType)oclGetProcAddress(handle,"clCreateContextFromType");
      pfn_clRetainContext = (p_pfn_clRetainContext)oclGetProcAddress(handle,"clRetainContext");
      pfn_clReleaseContext = (p_pfn_clReleaseContext)oclGetProcAddress(handle,"clReleaseContext");
      pfn_clGetContextInfo = (p_pfn_clGetContextInfo)oclGetProcAddress(handle,"clGetContextInfo");
      pfn_clCreateCommandQueue =
           (p_pfn_clCreateCommandQueue)oclGetProcAddress(handle,"clCreateCommandQueue");
      pfn_clRetainCommandQueue =
           (p_pfn_clRetainCommandQueue)oclGetProcAddress(handle,"clRetainCommandQueue");
      pfn_clReleaseCommandQueue =
           (p_pfn_clReleaseCommandQueue)oclGetProcAddress(handle,"clReleaseCommandQueue");
      pfn_clGetCommandQueueInfo =
           (p_pfn_clGetCommandQueueInfo)oclGetProcAddress(handle,"clGetCommandQueueInfo");
      pfn_clSetCommandQueueProperty =
           (p_pfn_clSetCommandQueueProperty)oclGetProcAddress(handle,"clSetCommandQueueProperty");
      pfn_clCreateBuffer = (p_pfn_clCreateBuffer)oclGetProcAddress(handle,"clCreateBuffer");
      pfn_clCreateImage2D = (p_pfn_clCreateImage2D)oclGetProcAddress(handle,"clCreateImage2D");
      pfn_clCreateImage3D = (p_pfn_clCreateImage3D)oclGetProcAddress(handle,"clCreateImage3D");
      pfn_clRetainMemObject = (p_pfn_clRetainMemObject)oclGetProcAddress(handle,"clRetainMemObject")
      ;
      pfn_clReleaseMemObject =
           (p_pfn_clReleaseMemObject)oclGetProcAddress(handle,"clReleaseMemObject");
      pfn_clGetSupportedImageFormats =
           (p_pfn_clGetSupportedImageFormats)oclGetProcAddress(handle,"clGetSupportedImageFormats");
      pfn_clGetMemObjectInfo =
           (p_pfn_clGetMemObjectInfo)oclGetProcAddress(handle,"clGetMemObjectInfo");
      pfn_clGetImageInfo = (p_pfn_clGetImageInfo)oclGetProcAddress(handle,"clGetImageInfo");
      pfn_clCreateSampler = (p_pfn_clCreateSampler)oclGetProcAddress(handle,"clCreateSampler");
      pfn_clRetainSampler = (p_pfn_clRetainSampler)oclGetProcAddress(handle,"clRetainSampler");
      pfn_clReleaseSampler = (p_pfn_clReleaseSampler)oclGetProcAddress(handle,"clReleaseSampler");
      pfn_clGetSamplerInfo = (p_pfn_clGetSamplerInfo)oclGetProcAddress(handle,"clGetSamplerInfo");
      pfn_clCreateProgramWithSource =
           (p_pfn_clCreateProgramWithSource)oclGetProcAddress(handle,"clCreateProgramWithSource");
      pfn_clCreateProgramWithBinary =
           (p_pfn_clCreateProgramWithBinary)oclGetProcAddress(handle,"clCreateProgramWithBinary");
      pfn_clRetainProgram = (p_pfn_clRetainProgram)oclGetProcAddress(handle,"clRetainProgram");
      pfn_clReleaseProgram = (p_pfn_clReleaseProgram)oclGetProcAddress(handle,"clReleaseProgram");
      pfn_clBuildProgram = (p_pfn_clBuildProgram)oclGetProcAddress(handle,"clBuildProgram");
      pfn_clUnloadCompiler = (p_pfn_clUnloadCompiler)oclGetProcAddress(handle,"clUnloadCompiler");
      pfn_clGetProgramInfo = (p_pfn_clGetProgramInfo)oclGetProcAddress(handle,"clGetProgramInfo");
      pfn_clGetProgramBuildInfo =
           (p_pfn_clGetProgramBuildInfo)oclGetProcAddress(handle,"clGetProgramBuildInfo");
      pfn_clCreateKernel = (p_pfn_clCreateKernel)oclGetProcAddress(handle,"clCreateKernel");
      pfn_clCreateKernelsInProgram =
           (p_pfn_clCreateKernelsInProgram)oclGetProcAddress(handle,"clCreateKernelsInProgram");
      pfn_clRetainKernel = (p_pfn_clRetainKernel)oclGetProcAddress(handle,"clRetainKernel");
      pfn_clReleaseKernel = (p_pfn_clReleaseKernel)oclGetProcAddress(handle,"clReleaseKernel");
      pfn_clSetKernelArg = (p_pfn_clSetKernelArg)oclGetProcAddress(handle,"clSetKernelArg");
      pfn_clGetKernelInfo = (p_pfn_clGetKernelInfo)oclGetProcAddress(handle,"clGetKernelInfo");
      pfn_clGetKernelWorkGroupInfo =
           (p_pfn_clGetKernelWorkGroupInfo)oclGetProcAddress(handle,"clGetKernelWorkGroupInfo");
      pfn_clWaitForEvents = (p_pfn_clWaitForEvents)oclGetProcAddress(handle,"clWaitForEvents");
      pfn_clGetEventInfo = (p_pfn_clGetEventInfo)oclGetProcAddress(handle,"clGetEventInfo");
      pfn_clRetainEvent = (p_pfn_clRetainEvent)oclGetProcAddress(handle,"clRetainEvent");
      pfn_clReleaseEvent = (p_pfn_clReleaseEvent)oclGetProcAddress(handle,"clReleaseEvent");
      pfn_clGetEventProfilingInfo =
           (p_pfn_clGetEventProfilingInfo)oclGetProcAddress(handle,"clGetEventProfilingInfo");
      pfn_clFlush = (p_pfn_clFlush)oclGetProcAddress(handle,"clFlush");
      pfn_clFinish = (p_pfn_clFinish)oclGetProcAddress(handle,"clFinish");
      pfn_clEnqueueReadBuffer =
           (p_pfn_clEnqueueReadBuffer)oclGetProcAddress(handle,"clEnqueueReadBuffer");
      pfn_clEnqueueReadBufferRect =
           (p_pfn_clEnqueueReadBufferRect)oclGetProcAddress(handle,"clEnqueueReadBufferRect");
      pfn_clEnqueueWriteBuffer =
           (p_pfn_clEnqueueWriteBuffer)oclGetProcAddress(handle,"clEnqueueWriteBuffer");
      pfn_clEnqueueWriteBufferRect =
           (p_pfn_clEnqueueWriteBufferRect)oclGetProcAddress(handle,"clEnqueueWriteBufferRect");
      pfn_clEnqueueCopyBuffer =
           (p_pfn_clEnqueueCopyBuffer)oclGetProcAddress(handle,"clEnqueueCopyBuffer");
      pfn_clEnqueueReadImage =
           (p_pfn_clEnqueueReadImage)oclGetProcAddress(handle,"clEnqueueReadImage");
      pfn_clEnqueueWriteImage =
           (p_pfn_clEnqueueWriteImage)oclGetProcAddress(handle,"clEnqueueWriteImage");
      pfn_clEnqueueCopyImage =
           (p_pfn_clEnqueueCopyImage)oclGetProcAddress(handle,"clEnqueueCopyImage");
      pfn_clEnqueueCopyImageToBuffer =
           (p_pfn_clEnqueueCopyImageToBuffer)oclGetProcAddress(handle,"clEnqueueCopyImageToBuffer");
      pfn_clEnqueueCopyBufferToImage =
           (p_pfn_clEnqueueCopyBufferToImage)oclGetProcAddress(handle,"clEnqueueCopyBufferToImage");
      pfn_clEnqueueMapBuffer =
           (p_pfn_clEnqueueMapBuffer)oclGetProcAddress(handle,"clEnqueueMapBuffer");
      pfn_clEnqueueMapImage = (p_pfn_clEnqueueMapImage)oclGetProcAddress(handle,"clEnqueueMapImage")
      ;
      pfn_clEnqueueUnmapMemObject =
           (p_pfn_clEnqueueUnmapMemObject)oclGetProcAddress(handle,"clEnqueueUnmapMemObject");
      pfn_clEnqueueNDRangeKernel =
           (p_pfn_clEnqueueNDRangeKernel)oclGetProcAddress(handle,"clEnqueueNDRangeKernel");
      pfn_clEnqueueTask = (p_pfn_clEnqueueTask)oclGetProcAddress(handle,"clEnqueueTask");
      pfn_clEnqueueNativeKernel =
           (p_pfn_clEnqueueNativeKernel)oclGetProcAddress(handle,"clEnqueueNativeKernel");
      pfn_clEnqueueMarker = (p_pfn_clEnqueueMarker)oclGetProcAddress(handle,"clEnqueueMarker");
      pfn_clEnqueueWaitForEvents =
           (p_pfn_clEnqueueWaitForEvents)oclGetProcAddress(handle,"clEnqueueWaitForEvents");
      pfn_clEnqueueBarrier = (p_pfn_clEnqueueBarrier)oclGetProcAddress(handle,"clEnqueueBarrier");
      pfn_clGetExtensionFunctionAddress =
           (p_pfn_clGetExtensionFunctionAddress)
           oclGetProcAddress(handle,"clGetExtensionFunctionAddress");
      lib._4_4_ = 1;
    }
  }
  else {
    lib._4_4_ = 1;
  }
  return lib._4_4_;
}

Assistant:

int ocl_init(void)
{
	if (pfn_clGetPlatformIDs) return 1;

	OclLibrary lib = oclLoadLibrary();
	if (!lib) return 0;

	pfn_clGetPlatformIDs				= (p_pfn_clGetPlatformIDs)				oclGetProcAddress(lib, "clGetPlatformIDs");
	pfn_clGetPlatformInfo				= (p_pfn_clGetPlatformInfo)				oclGetProcAddress(lib, "clGetPlatformInfo");
	pfn_clGetDeviceIDs					= (p_pfn_clGetDeviceIDs)				oclGetProcAddress(lib, "clGetDeviceIDs");
	pfn_clGetDeviceInfo					= (p_pfn_clGetDeviceInfo)				oclGetProcAddress(lib, "clGetDeviceInfo");
	pfn_clCreateContext					= (p_pfn_clCreateContext)				oclGetProcAddress(lib, "clCreateContext");
	pfn_clCreateContextFromType			= (p_pfn_clCreateContextFromType)		oclGetProcAddress(lib, "clCreateContextFromType");
	pfn_clRetainContext					= (p_pfn_clRetainContext)				oclGetProcAddress(lib, "clRetainContext");
	pfn_clReleaseContext				= (p_pfn_clReleaseContext)				oclGetProcAddress(lib, "clReleaseContext");
	pfn_clGetContextInfo				= (p_pfn_clGetContextInfo)				oclGetProcAddress(lib, "clGetContextInfo");
	pfn_clCreateCommandQueue			= (p_pfn_clCreateCommandQueue)			oclGetProcAddress(lib, "clCreateCommandQueue");
	pfn_clRetainCommandQueue			= (p_pfn_clRetainCommandQueue)			oclGetProcAddress(lib, "clRetainCommandQueue");
	pfn_clReleaseCommandQueue			= (p_pfn_clReleaseCommandQueue)			oclGetProcAddress(lib, "clReleaseCommandQueue");
	pfn_clGetCommandQueueInfo			= (p_pfn_clGetCommandQueueInfo)			oclGetProcAddress(lib, "clGetCommandQueueInfo");
	pfn_clSetCommandQueueProperty		= (p_pfn_clSetCommandQueueProperty)		oclGetProcAddress(lib, "clSetCommandQueueProperty");
	pfn_clCreateBuffer					= (p_pfn_clCreateBuffer)				oclGetProcAddress(lib, "clCreateBuffer");
	pfn_clCreateImage2D					= (p_pfn_clCreateImage2D)				oclGetProcAddress(lib, "clCreateImage2D");
	pfn_clCreateImage3D					= (p_pfn_clCreateImage3D)				oclGetProcAddress(lib, "clCreateImage3D");
	pfn_clRetainMemObject				= (p_pfn_clRetainMemObject)				oclGetProcAddress(lib, "clRetainMemObject");
	pfn_clReleaseMemObject				= (p_pfn_clReleaseMemObject)			oclGetProcAddress(lib, "clReleaseMemObject");
	pfn_clGetSupportedImageFormats		= (p_pfn_clGetSupportedImageFormats)	oclGetProcAddress(lib, "clGetSupportedImageFormats");
	pfn_clGetMemObjectInfo				= (p_pfn_clGetMemObjectInfo)			oclGetProcAddress(lib, "clGetMemObjectInfo");
	pfn_clGetImageInfo					= (p_pfn_clGetImageInfo)				oclGetProcAddress(lib, "clGetImageInfo");
	pfn_clCreateSampler					= (p_pfn_clCreateSampler)				oclGetProcAddress(lib, "clCreateSampler");
	pfn_clRetainSampler					= (p_pfn_clRetainSampler)				oclGetProcAddress(lib, "clRetainSampler");
	pfn_clReleaseSampler				= (p_pfn_clReleaseSampler)				oclGetProcAddress(lib, "clReleaseSampler");
	pfn_clGetSamplerInfo				= (p_pfn_clGetSamplerInfo)				oclGetProcAddress(lib, "clGetSamplerInfo");
	pfn_clCreateProgramWithSource		= (p_pfn_clCreateProgramWithSource)		oclGetProcAddress(lib, "clCreateProgramWithSource");
	pfn_clCreateProgramWithBinary		= (p_pfn_clCreateProgramWithBinary)		oclGetProcAddress(lib, "clCreateProgramWithBinary");
	pfn_clRetainProgram					= (p_pfn_clRetainProgram)				oclGetProcAddress(lib, "clRetainProgram");
	pfn_clReleaseProgram				= (p_pfn_clReleaseProgram)				oclGetProcAddress(lib, "clReleaseProgram");
	pfn_clBuildProgram					= (p_pfn_clBuildProgram)				oclGetProcAddress(lib, "clBuildProgram");
	pfn_clUnloadCompiler				= (p_pfn_clUnloadCompiler)				oclGetProcAddress(lib, "clUnloadCompiler");
	pfn_clGetProgramInfo				= (p_pfn_clGetProgramInfo)				oclGetProcAddress(lib, "clGetProgramInfo");
	pfn_clGetProgramBuildInfo			= (p_pfn_clGetProgramBuildInfo)			oclGetProcAddress(lib, "clGetProgramBuildInfo");
	pfn_clCreateKernel					= (p_pfn_clCreateKernel)				oclGetProcAddress(lib, "clCreateKernel");
	pfn_clCreateKernelsInProgram		= (p_pfn_clCreateKernelsInProgram)		oclGetProcAddress(lib, "clCreateKernelsInProgram");
	pfn_clRetainKernel					= (p_pfn_clRetainKernel)				oclGetProcAddress(lib, "clRetainKernel");
	pfn_clReleaseKernel					= (p_pfn_clReleaseKernel)				oclGetProcAddress(lib, "clReleaseKernel");
	pfn_clSetKernelArg					= (p_pfn_clSetKernelArg)				oclGetProcAddress(lib, "clSetKernelArg");
	pfn_clGetKernelInfo					= (p_pfn_clGetKernelInfo)				oclGetProcAddress(lib, "clGetKernelInfo");
	pfn_clGetKernelWorkGroupInfo		= (p_pfn_clGetKernelWorkGroupInfo)		oclGetProcAddress(lib, "clGetKernelWorkGroupInfo");
	pfn_clWaitForEvents					= (p_pfn_clWaitForEvents)				oclGetProcAddress(lib, "clWaitForEvents");
	pfn_clGetEventInfo					= (p_pfn_clGetEventInfo)				oclGetProcAddress(lib, "clGetEventInfo");
	pfn_clRetainEvent					= (p_pfn_clRetainEvent)					oclGetProcAddress(lib, "clRetainEvent");
	pfn_clReleaseEvent					= (p_pfn_clReleaseEvent)				oclGetProcAddress(lib, "clReleaseEvent");
	pfn_clGetEventProfilingInfo			= (p_pfn_clGetEventProfilingInfo)		oclGetProcAddress(lib, "clGetEventProfilingInfo");
	pfn_clFlush							= (p_pfn_clFlush)						oclGetProcAddress(lib, "clFlush");
	pfn_clFinish						= (p_pfn_clFinish)						oclGetProcAddress(lib, "clFinish");
	pfn_clEnqueueReadBuffer				= (p_pfn_clEnqueueReadBuffer)			oclGetProcAddress(lib, "clEnqueueReadBuffer");
	pfn_clEnqueueReadBufferRect			= (p_pfn_clEnqueueReadBufferRect)		oclGetProcAddress(lib, "clEnqueueReadBufferRect");
	pfn_clEnqueueWriteBuffer			= (p_pfn_clEnqueueWriteBuffer)			oclGetProcAddress(lib, "clEnqueueWriteBuffer");
	pfn_clEnqueueWriteBufferRect		= (p_pfn_clEnqueueWriteBufferRect)		oclGetProcAddress(lib, "clEnqueueWriteBufferRect");
	pfn_clEnqueueCopyBuffer				= (p_pfn_clEnqueueCopyBuffer)			oclGetProcAddress(lib, "clEnqueueCopyBuffer");
	pfn_clEnqueueReadImage				= (p_pfn_clEnqueueReadImage)			oclGetProcAddress(lib, "clEnqueueReadImage");
	pfn_clEnqueueWriteImage				= (p_pfn_clEnqueueWriteImage)			oclGetProcAddress(lib, "clEnqueueWriteImage");
	pfn_clEnqueueCopyImage				= (p_pfn_clEnqueueCopyImage)			oclGetProcAddress(lib, "clEnqueueCopyImage");
	pfn_clEnqueueCopyImageToBuffer		= (p_pfn_clEnqueueCopyImageToBuffer)	oclGetProcAddress(lib, "clEnqueueCopyImageToBuffer");
	pfn_clEnqueueCopyBufferToImage		= (p_pfn_clEnqueueCopyBufferToImage)	oclGetProcAddress(lib, "clEnqueueCopyBufferToImage");
	pfn_clEnqueueMapBuffer				= (p_pfn_clEnqueueMapBuffer)			oclGetProcAddress(lib, "clEnqueueMapBuffer");
	pfn_clEnqueueMapImage				= (p_pfn_clEnqueueMapImage)				oclGetProcAddress(lib, "clEnqueueMapImage");
	pfn_clEnqueueUnmapMemObject			= (p_pfn_clEnqueueUnmapMemObject)		oclGetProcAddress(lib, "clEnqueueUnmapMemObject");
	pfn_clEnqueueNDRangeKernel			= (p_pfn_clEnqueueNDRangeKernel)		oclGetProcAddress(lib, "clEnqueueNDRangeKernel");
	pfn_clEnqueueTask					= (p_pfn_clEnqueueTask)					oclGetProcAddress(lib, "clEnqueueTask");
	pfn_clEnqueueNativeKernel			= (p_pfn_clEnqueueNativeKernel)			oclGetProcAddress(lib, "clEnqueueNativeKernel");
	pfn_clEnqueueMarker					= (p_pfn_clEnqueueMarker)				oclGetProcAddress(lib, "clEnqueueMarker");
	pfn_clEnqueueWaitForEvents			= (p_pfn_clEnqueueWaitForEvents)		oclGetProcAddress(lib, "clEnqueueWaitForEvents");
	pfn_clEnqueueBarrier				= (p_pfn_clEnqueueBarrier)				oclGetProcAddress(lib, "clEnqueueBarrier");
	pfn_clGetExtensionFunctionAddress	= (p_pfn_clGetExtensionFunctionAddress)	oclGetProcAddress(lib, "clGetExtensionFunctionAddress");

	return 1;
}